

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::BIT_AB(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  
  this->cycles = 4;
  uVar1 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar1);
  (this->field_6).ps =
       (byte)iVar2 & 0xc0 | (this->field_6).ps & 0x3d | ((this->A & (byte)iVar2) == 0) * '\x02';
  return;
}

Assistant:

void CPU::BIT_AB()
{
    cycles = 4;
    uint8_t data = ReadByte(GetWord());
    Z = !(A & data);
    V = (data & 0b01000000) > 0;
    N = (data & 0b10000000) > 0;
}